

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O3

void __thiscall pmx::PmxSetting::Read(PmxSetting *this,istream *stream)

{
  runtime_error *this_00;
  uint uVar1;
  uint8_t count;
  uint8_t temp;
  byte local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::istream::read((char *)stream,(long)&local_41);
  if (7 < local_41) {
    std::istream::read((char *)stream,(long)this);
    std::istream::read((char *)stream,(long)&this->uv);
    std::istream::read((char *)stream,(long)&this->vertex_index_size);
    std::istream::read((char *)stream,(long)&this->texture_index_size);
    std::istream::read((char *)stream,(long)&this->material_index_size);
    std::istream::read((char *)stream,(long)&this->bone_index_size);
    std::istream::read((char *)stream,(long)&this->morph_index_size);
    std::istream::read((char *)stream,(long)&this->rigidbody_index_size);
    if (8 < local_41) {
      uVar1 = 8;
      do {
        std::istream::read((char *)stream,(long)local_40);
        uVar1 = uVar1 + 1;
      } while (uVar1 < local_41);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"MMD: invalid size","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_007da4b8;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PmxSetting::Read(std::istream *stream)
	{
		uint8_t count;
		stream->read((char*) &count, sizeof(uint8_t));
		if (count < 8)
		{
			throw DeadlyImportError("MMD: invalid size");
		}
		stream->read((char*) &encoding, sizeof(uint8_t));
		stream->read((char*) &uv, sizeof(uint8_t));
		stream->read((char*) &vertex_index_size, sizeof(uint8_t));
		stream->read((char*) &texture_index_size, sizeof(uint8_t));
		stream->read((char*) &material_index_size, sizeof(uint8_t));
		stream->read((char*) &bone_index_size, sizeof(uint8_t));
		stream->read((char*) &morph_index_size, sizeof(uint8_t));
		stream->read((char*) &rigidbody_index_size, sizeof(uint8_t));
		uint8_t temp;
		for (int i = 8; i < count; i++)
		{
			stream->read((char*)&temp, sizeof(uint8_t));
		}
	}